

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

GrowingAlignedDataBuffer * __thiscall
siamese::DecoderPacketWindow::GetSum
          (DecoderPacketWindow *this,uint laneIndex,uint sumIndex,uint elementEnd)

{
  ostringstream *this_00;
  uint bytes;
  DecoderSubwindow *pDVar1;
  ulong uVar2;
  bool bVar3;
  GrowingAlignedDataBuffer *this_01;
  OutputWorker *this_02;
  uint8_t y;
  OriginalPacket *pOVar4;
  char *pcVar5;
  uint uVar6;
  LogStringBuffer local_1b8;
  
  uVar6 = this->Lanes[laneIndex].Sums[sumIndex].ElementEnd;
  if (uVar6 < elementEnd) {
    this_00 = &local_1b8.LogStream;
    this_01 = &this->Lanes[laneIndex].Sums[sumIndex].Buffer;
    do {
      pDVar1 = (this->Subwindows).DataPtr[uVar6 >> 6];
      bytes = (pDVar1->Originals)._M_elems[uVar6 & 0x3f].Buffer.Bytes;
      if (DAT_001ff7f0 < 3) {
        local_1b8.ChannelName = Logger;
        local_1b8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&DAT_001ff820);
        std::operator<<((ostream *)this_00,"Lane ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," sum ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," accumulating column: ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,". Got = ");
        pcVar5 = "true";
        if (bytes == 0) {
          pcVar5 = "false";
        }
        std::operator<<((ostream *)this_00,pcVar5);
        this_02 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_02,&local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
      if (bytes != 0) {
        if ((this->Lanes[laneIndex].Sums[sumIndex].Buffer.Bytes < bytes) &&
           (bVar3 = GrowingAlignedDataBuffer::GrowZeroPadded(this_01,this->TheAllocator,bytes),
           !bVar3)) {
          this->EmergencyDisabled = true;
          goto LAB_0016bf54;
        }
        pOVar4 = (pDVar1->Originals)._M_elems + (uVar6 & 0x3f);
        if (sumIndex == 0) {
          gf256_add_mem(this_01->Data,(pOVar4->Buffer).Data,bytes);
        }
        else {
          uVar2 = (ulong)(pOVar4->Column * 199) % 0xfd;
          y = (char)uVar2 + '\x03';
          if (sumIndex == 2) {
            y = GF256Ctx.GF256_SQR_TABLE[uVar2 + 3];
          }
          gf256_muladd_mem(this_01->Data,y,(pOVar4->Buffer).Data,bytes);
        }
      }
      uVar6 = uVar6 + 8;
    } while (uVar6 < elementEnd);
    this->Lanes[laneIndex].Sums[sumIndex].ElementEnd = uVar6;
  }
LAB_0016bf54:
  return &this->Lanes[laneIndex].Sums[sumIndex].Buffer;
}

Assistant:

const GrowingAlignedDataBuffer* DecoderPacketWindow::GetSum(unsigned laneIndex, unsigned sumIndex, unsigned elementEnd)
{
    DecoderSum& sum = Lanes[laneIndex].Sums[sumIndex];

    SIAMESE_DEBUG_ASSERT(sum.ElementStart <= sum.ElementEnd);
    SIAMESE_DEBUG_ASSERT((sum.ElementStart + ColumnStart) % kColumnLaneCount == laneIndex);
    SIAMESE_DEBUG_ASSERT((sum.ElementEnd + ColumnStart) % kColumnLaneCount == laneIndex);

    unsigned element = sum.ElementEnd;
    if (element >= elementEnd) {
        return &sum.Buffer;
    }

    // For each element to accumulate in this lane:
    do
    {
        SIAMESE_DEBUG_ASSERT((element + ColumnStart) % kColumnLaneCount == laneIndex);
        OriginalPacket* original     = GetWindowElement(element);
        const unsigned originalBytes = original->Buffer.Bytes;

        Logger.Info("Lane ", laneIndex,  " sum ",  sumIndex,  " accumulating column: ",  element + ColumnStart,  ". Got = ",  (originalBytes > 0));

        if (originalBytes > 0)
        {
            SIAMESE_DEBUG_ASSERT(original->Column % kColumnLaneCount == laneIndex);
            if (originalBytes > sum.Buffer.Bytes)
            {
                // Grow sum to encompass the original data
                if (!sum.Buffer.GrowZeroPadded(TheAllocator, originalBytes))
                {
                    EmergencyDisabled = true;
                    goto ExitSum;
                }
            }

            // Sum += PacketData
            if (sumIndex == 0)
                gf256_add_mem(sum.Buffer.Data, original->Buffer.Data, originalBytes);
            else
            {
                uint8_t CX = GetColumnValue(original->Column);
                if (sumIndex == 2)
                    CX = gf256_sqr(CX);

                // Sum += CX * PacketData
                gf256_muladd_mem(sum.Buffer.Data, CX, original->Buffer.Data, originalBytes);
            }
        }

        SIAMESE_DEBUG_ASSERT(original->Buffer.Bytes == 0 || original->Column % kColumnLaneCount == laneIndex);
        element += kColumnLaneCount;
    } while (element < elementEnd);

    SIAMESE_DEBUG_ASSERT((element + ColumnStart) % kColumnLaneCount == laneIndex);

    sum.ElementEnd = element;

ExitSum:
    return &sum.Buffer;
}